

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestHarness_cTest.cpp
# Opt level: O0

Utest * __thiscall
TEST_TestHarness_c_checkString_TestShell::createTest(TEST_TestHarness_c_checkString_TestShell *this)

{
  TEST_TestHarness_c_checkString_Test *this_00;
  TEST_TestHarness_c_checkString_TestShell *this_local;
  
  this_00 = (TEST_TestHarness_c_checkString_Test *)
            operator_new(0x10,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestHarness_cTest.cpp"
                         ,0x208);
  TEST_TestHarness_c_checkString_Test::TEST_TestHarness_c_checkString_Test(this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(TestHarness_c, checkString)
{
    CHECK_EQUAL_C_STRING("Hello", "Hello");
    fixture->setTestFunction(failStringMethod_);
    fixture->runAllTests();

    StringEqualFailure failure(UtestShell::getCurrent(), "file", 1, "Hello", "Hello World", "");
    fixture->assertPrintContains(failure.getMessage());
    fixture->assertPrintContains("arness_c");
    CHECK(!hasDestructorOfTheDestructorCheckedBeenCalled);
}